

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::MakeBorderRouterChoice
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,BorderRouter *br)

{
  string *this_00;
  ushort uVar1;
  undefined1 uVar2;
  uint16_t uVar3;
  State SVar4;
  NetworkId NVar5;
  pointer pBVar6;
  Status SVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  time_t tVar10;
  iterator __end3;
  char *pcVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  iterator __begin3;
  pointer pBVar12;
  value_type *pvVar13;
  value_type *pvVar14;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  BRArray brs;
  BRArray choice;
  Network nwk;
  BorderRouterArray local_158;
  string local_138;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  local_118;
  undefined1 local_100 [8];
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_d8 [8];
  char *pcStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  format_string_checker<char> *local_b8;
  code *local_b0;
  pointer local_a8;
  char *pcStack_a0;
  Network local_90;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_118.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_118.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  persistent_storage::Network::Network(&local_90);
  SVar7 = persistent_storage::Registry::GetBorderRoutersInNetwork
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,aNid,&local_158);
  pBVar6 = local_158.
           super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (SVar7 == kSuccess) {
    if ((long)local_158.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x188) {
      *(undefined8 *)&br->mId =
           *(undefined8 *)
            &(local_158.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start)->mId;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
      (br->mAgent).mPort = (pBVar6->mAgent).mPort;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(br->mAgent).mDiscriminator,&(pBVar6->mAgent).mDiscriminator);
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
      *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pBVar6->mAgent).mState;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
      (br->mAgent).mExtendedPanId = (pBVar6->mAgent).mExtendedPanId;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
      (br->mAgent).mPartitionId = (pBVar6->mAgent).mPartitionId;
      (br->mAgent).mActiveTimestamp = (pBVar6->mAgent).mActiveTimestamp;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(br->mAgent).mVendorOui,&(pBVar6->mAgent).mVendorOui);
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
      uVar2 = (pBVar6->mAgent).field_0x141;
      uVar3 = (pBVar6->mAgent).mBbrPort;
      (br->mAgent).mBbrSeqNumber = (pBVar6->mAgent).mBbrSeqNumber;
      (br->mAgent).field_0x141 = uVar2;
      (br->mAgent).mBbrPort = uVar3;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
      (br->mAgent).mPresentFlags = (pBVar6->mAgent).mPresentFlags;
      tVar10 = (pBVar6->mAgent).mUpdateTimestamp.mTime;
LAB_00158c7b:
      (br->mAgent).mUpdateTimestamp.mTime = tVar10;
      goto LAB_00158c82;
    }
    SVar7 = persistent_storage::Registry::GetNetworkByXpan
                      ((this->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,aNid,&local_90);
    pBVar6 = local_158.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (SVar7 == kSuccess) {
      if (local_90.mCcm < 1) {
        if (local_158.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_158.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pBVar12 = local_158.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (((uint)(pBVar12->mAgent).mState & 7) != 0) {
              std::
              vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ::push_back(&local_118,pBVar12);
            }
            pBVar12 = pBVar12 + 1;
          } while (pBVar12 != pBVar6);
        }
      }
      else {
        pvVar14 = local_158.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_158.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_158.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            SVar4 = (pvVar14->mAgent).mState;
            if (((((uint)SVar4 & 0x18) != 0) && (((uint)SVar4 & 0x180) == 0x180)) &&
               (((uint)SVar4 & 7) != 0)) {
              NVar5.mId = (pvVar14->mNetworkId).mId;
              br->mId = (BorderRouterId)(pvVar14->mId).mId;
              br->mNetworkId = (NetworkId)NVar5.mId;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
              (br->mAgent).mPort = (pvVar14->mAgent).mPort;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&(br->mAgent).mDiscriminator,&(pvVar14->mAgent).mDiscriminator);
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
              *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pvVar14->mAgent).mState;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
              (br->mAgent).mExtendedPanId = (pvVar14->mAgent).mExtendedPanId;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
              (br->mAgent).mPartitionId = (pvVar14->mAgent).mPartitionId;
              (br->mAgent).mActiveTimestamp = (pvVar14->mAgent).mActiveTimestamp;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&(br->mAgent).mVendorOui,&(pvVar14->mAgent).mVendorOui);
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
              uVar2 = (pvVar14->mAgent).field_0x141;
              uVar3 = (pvVar14->mAgent).mBbrPort;
              (br->mAgent).mBbrSeqNumber = (pvVar14->mAgent).mBbrSeqNumber;
              (br->mAgent).field_0x141 = uVar2;
              (br->mAgent).mBbrPort = uVar3;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
              goto LAB_001592bb;
            }
            pvVar14 = pvVar14 + 1;
          } while (pvVar14 !=
                   local_158.
                   super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          if (local_158.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_158.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pBVar12 = local_158.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              uVar1 = *(ushort *)&(pBVar12->mAgent).mState;
              if ((uVar1 & 7) != 0 && (char)uVar1 < '\0') {
                std::
                vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ::push_back(&local_118,pBVar12);
              }
              pBVar12 = pBVar12 + 1;
            } while (pBVar12 != pBVar6);
          }
        }
      }
      pvVar14 = local_118.
                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_118.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_118.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          SVar4 = (pvVar14->mAgent).mState;
          if (((uint)SVar4 & 0x60) != 0 && ((uint)SVar4 & 0x10) != 0) {
            NVar5.mId = (pvVar14->mNetworkId).mId;
            br->mId = (BorderRouterId)(pvVar14->mId).mId;
            br->mNetworkId = (NetworkId)NVar5.mId;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
            (br->mAgent).mPort = (pvVar14->mAgent).mPort;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&(br->mAgent).mDiscriminator,&(pvVar14->mAgent).mDiscriminator);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
            *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pvVar14->mAgent).mState;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
            (br->mAgent).mExtendedPanId = (pvVar14->mAgent).mExtendedPanId;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
            (br->mAgent).mPartitionId = (pvVar14->mAgent).mPartitionId;
            (br->mAgent).mActiveTimestamp = (pvVar14->mAgent).mActiveTimestamp;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&(br->mAgent).mVendorOui,&(pvVar14->mAgent).mVendorOui);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
            uVar2 = (pvVar14->mAgent).field_0x141;
            uVar3 = (pvVar14->mAgent).mBbrPort;
            (br->mAgent).mBbrSeqNumber = (pvVar14->mAgent).mBbrSeqNumber;
            (br->mAgent).field_0x141 = uVar2;
            (br->mAgent).mBbrPort = uVar3;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
            goto LAB_001592bb;
          }
          pvVar14 = pvVar14 + 1;
        } while (pvVar14 !=
                 local_118.
                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        pvVar14 = local_118.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_118.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_118.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00158f23:
          if (((uint)(pvVar14->mAgent).mState & 0x10) == 0) goto code_r0x00158f2e;
          NVar5.mId = (pvVar14->mNetworkId).mId;
          br->mId = (BorderRouterId)(pvVar14->mId).mId;
          br->mNetworkId = (NetworkId)NVar5.mId;
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
          (br->mAgent).mPort = (pvVar14->mAgent).mPort;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(br->mAgent).mDiscriminator,&(pvVar14->mAgent).mDiscriminator);
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
          *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pvVar14->mAgent).mState;
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
          (br->mAgent).mExtendedPanId = (pvVar14->mAgent).mExtendedPanId;
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
          (br->mAgent).mPartitionId = (pvVar14->mAgent).mPartitionId;
          (br->mAgent).mActiveTimestamp = (pvVar14->mAgent).mActiveTimestamp;
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&(br->mAgent).mVendorOui,&(pvVar14->mAgent).mVendorOui);
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
          uVar2 = (pvVar14->mAgent).field_0x141;
          uVar3 = (pvVar14->mAgent).mBbrPort;
          (br->mAgent).mBbrSeqNumber = (pvVar14->mAgent).mBbrSeqNumber;
          (br->mAgent).field_0x141 = uVar2;
          (br->mAgent).mBbrPort = uVar3;
          std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
LAB_001592bb:
          (br->mAgent).mPresentFlags = (pvVar14->mAgent).mPresentFlags;
          tVar10 = (pvVar14->mAgent).mUpdateTimestamp.mTime;
          goto LAB_00158c7b;
        }
      }
LAB_00158f54:
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_138;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_100,(v10 *)"no active BR found",(string_view)ZEXT816(0x12),args_01)
      ;
      local_d8._0_4_ = 5;
      pcStack_d0 = local_c8._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_d0,CONCAT44(local_100._4_4_,local_100._0_4_),
                 local_f8 + CONCAT44(local_100._4_4_,local_100._0_4_));
      __return_storage_ptr__->mCode = local_d8._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&pcStack_d0);
      if (pcStack_d0 != local_c8._M_local_buf + 8) {
        operator_delete(pcStack_d0);
      }
      paVar9 = &local_f0;
    }
    else {
      local_d8._0_4_ = 0xd;
      pcStack_d0 = "network not found by XPAN \'{}\'";
      local_c8._M_allocated_capacity = 0x1e;
      local_c8._8_8_ = 0x100000000;
      local_b0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar11 = "network not found by XPAN \'{}\'";
      local_b8 = (format_string_checker<char> *)local_d8;
      do {
        pcVar8 = pcVar11 + 1;
        if (*pcVar11 == '}') {
          if ((pcVar8 == "") || (*pcVar8 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar8 = pcVar11 + 2;
        }
        else if (*pcVar11 == '{') {
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar11,"",(format_string_checker<char> *)local_d8);
        }
        pcVar11 = pcVar8;
      } while (pcVar8 != "");
      utils::Hex<unsigned_long>((string *)local_d8,aNid);
      local_a8 = (pointer)local_d8;
      pcStack_a0 = pcStack_d0;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1e;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_a8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_138,(v10 *)"network not found by XPAN \'{}\'",fmt_00,args_00);
      local_100._0_4_ = kNotFound;
      local_f8 = local_f0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      __return_storage_ptr__->mCode = local_100._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
      if (local_f8 != local_f0._M_local_buf + 8) {
        operator_delete(local_f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      paVar9 = &local_c8;
    }
  }
  else {
    local_d8._0_4_ = int_type;
    pcStack_d0 = "br lookup failed with status={}";
    local_c8._M_allocated_capacity = 0x1f;
    local_c8._8_8_ = 0x100000000;
    local_b0 = ::fmt::v10::detail::
               parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar11 = "br lookup failed with status={}";
    local_b8 = (format_string_checker<char> *)local_d8;
    do {
      pcVar8 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar11,"",(format_string_checker<char> *)local_d8);
      }
      pcVar11 = pcVar8;
    } while (pcVar8 != "");
    local_d8 = (undefined1  [8])(ulong)SVar7;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x1f;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_d8;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,(v10 *)"br lookup failed with status={}",fmt,args);
    local_100._0_4_ = kRegistryError;
    local_f8 = local_f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    __return_storage_ptr__->mCode = local_100._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
    if (local_f8 != local_f0._M_local_buf + 8) {
      operator_delete(local_f8);
    }
    paVar9 = &local_138.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar9->_M_allocated_capacity)[-2] != paVar9) {
    operator_delete((undefined1 *)(&paVar9->_M_allocated_capacity)[-2]);
  }
LAB_00158c82:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
    operator_delete(local_90.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
    operator_delete(local_90.mName._M_dataplus._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&local_118);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&local_158);
  return __return_storage_ptr__;
code_r0x00158f2e:
  pvVar14 = pvVar14 + 1;
  pvVar13 = local_118.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar14 ==
      local_118.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00158f4f;
  goto LAB_00158f23;
LAB_00158f4f:
  if (pvVar13 ==
      local_118.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00158f54;
  if (((uint)(pvVar13->mAgent).mState & 0x18) != 0) {
    NVar5.mId = (pvVar13->mNetworkId).mId;
    br->mId = (BorderRouterId)(pvVar13->mId).mId;
    br->mNetworkId = (NetworkId)NVar5.mId;
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
    (br->mAgent).mPort = (pvVar13->mAgent).mPort;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(br->mAgent).mDiscriminator,&(pvVar13->mAgent).mDiscriminator);
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
    *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pvVar13->mAgent).mState;
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
    (br->mAgent).mExtendedPanId = (pvVar13->mAgent).mExtendedPanId;
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
    (br->mAgent).mPartitionId = (pvVar13->mAgent).mPartitionId;
    (br->mAgent).mActiveTimestamp = (pvVar13->mAgent).mActiveTimestamp;
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(br->mAgent).mVendorOui,&(pvVar13->mAgent).mVendorOui);
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
    uVar2 = (pvVar13->mAgent).field_0x141;
    uVar3 = (pvVar13->mAgent).mBbrPort;
    (br->mAgent).mBbrSeqNumber = (pvVar13->mAgent).mBbrSeqNumber;
    (br->mAgent).field_0x141 = uVar2;
    (br->mAgent).mBbrPort = uVar3;
    std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
    (br->mAgent).mPresentFlags = (pvVar13->mAgent).mPresentFlags;
    tVar10 = (pvVar13->mAgent).mUpdateTimestamp.mTime;
    goto LAB_00158c7b;
  }
  pvVar13 = pvVar13 + 1;
  goto LAB_00158f4f;
}

Assistant:

Error JobManager::MakeBorderRouterChoice(uint64_t aNid, BorderRouter &br)
{
    Error          error;
    BRArray        brs;
    BRArray        choice;
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));
    if (brs.size() == 1)
    {
        // looks like not much of a choice
        br = brs.front();
        ExitNow();
    }
    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    if (nwk.mCcm > 0) // Dealing with domain network
    {
        // - try to find active and connectable Primary BBR
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsPrimary &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                if (item.mAgent.mState.mBbrIsActive &&
                    item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
                {
                    /// @todo: ideally here we would make sure the
                    ///        Border Router's connection mode @ref
                    ///        BorderAgent::State::ConnectionMode::kX509Connection
                    ///        is specified, otherwise the announced
                    ///        BBR appears inconsistent with Thread
                    ///        spec. Although nothing we could do at
                    ///        runtime here, a warning message might
                    ///        be useful as an indication of a
                    ///        potential issue
                    br = item;
                    ExitNow();
                }
            }
        }
        // - go on with other active and connectable BBRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsActive &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }
    else // Dealing with standalone networks
    {
        // go on with connectable BRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }

    // Below a final triage is done

    // - prefer br with high-availability
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive &&
            item.mAgent.mState.mAvailability > BorderAgent::State::Availability::kInfrequent)
        {
            br = item;
            ExitNow();
        }
    }
    // - prefer br with Thread Interface actively participating in communication
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive)
        {
            br = item;
            ExitNow();
        }
    }
    // - try to find br with Thread Interface at least enabled
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
        {
            br = item;
            ExitNow();
        }
    }
    error = ERROR_NOT_FOUND("no active BR found");
exit:
    return error;
}